

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O3

int arkRootfind(void *arkode_mem)

{
  int iVar1;
  undefined8 *puVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkRootfind","arkode_mem = NULL illegal.");
    return -0x15;
  }
  puVar2 = *(undefined8 **)((long)arkode_mem + 0x280);
  iVar5 = *(int *)(puVar2 + 1);
  lVar6 = (long)iVar5;
  if (lVar6 < 1) {
    puVar2[6] = puVar2[5];
    return 0;
  }
  bVar13 = true;
  bVar4 = false;
  iVar7 = 0;
  lVar10 = 0;
  dVar21 = 0.0;
LAB_004dd4d6:
  do {
    lVar9 = lVar10 + 1;
    if (*(int *)(puVar2[0xe] + -4 + lVar9 * 4) != 0) {
      dVar17 = *(double *)(puVar2[8] + -8 + lVar9 * 8);
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        dVar18 = *(double *)(puVar2[7] + -8 + lVar9 * 8);
        if (((dVar17 * dVar18 < 0.0) &&
            ((double)*(int *)(puVar2[3] + -4 + lVar9 * 4) * dVar18 <= 0.0)) &&
           (dVar17 = ABS(dVar17 / (dVar17 - dVar18)), dVar21 < dVar17)) {
          iVar7 = (int)lVar10;
          bVar13 = false;
          lVar10 = lVar9;
          dVar21 = dVar17;
          if (lVar9 == lVar6) {
            iVar7 = (int)lVar9 + -1;
            goto LAB_004dd680;
          }
          goto LAB_004dd4d6;
        }
      }
      else if ((double)*(int *)(puVar2[3] + -4 + lVar9 * 4) *
               *(double *)(puVar2[7] + -8 + lVar9 * 8) <= 0.0) {
        bVar4 = true;
      }
    }
    lVar10 = lVar9;
  } while (lVar9 != lVar6);
  if (bVar13) {
    puVar2[6] = puVar2[5];
    if (iVar5 < 1) {
      return (uint)bVar4;
    }
    lVar10 = puVar2[8];
    lVar9 = puVar2[9];
    lVar11 = 0;
    do {
      *(undefined8 *)(lVar9 + lVar11 * 8) = *(undefined8 *)(lVar10 + lVar11 * 8);
      lVar11 = lVar11 + 1;
    } while (lVar6 != lVar11);
    if (bVar4) {
      if (0 < iVar5) {
        lVar6 = puVar2[2];
        lVar10 = puVar2[0xe];
        lVar9 = 0;
        do {
          *(undefined4 *)(lVar6 + lVar9 * 4) = 0;
          if (((*(int *)(lVar10 + lVar9 * 4) != 0) &&
              (dVar21 = *(double *)(puVar2[8] + lVar9 * 8), dVar21 == 0.0)) && (!NAN(dVar21))) {
            *(uint *)(lVar6 + lVar9 * 4) =
                 (uint)(*(double *)(puVar2[7] + lVar9 * 8) <= 0.0) * 2 + -1;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)(puVar2 + 1));
        return 1;
      }
      return (uint)bVar4;
    }
    return (uint)bVar4;
  }
LAB_004dd680:
  dVar21 = (double)puVar2[4];
  dVar18 = (double)puVar2[5];
  dVar16 = dVar18 - dVar21;
  dVar3 = ABS(dVar16);
  dVar17 = (double)puVar2[0xb];
  if (dVar17 < dVar3) {
    dVar19 = 0.5;
    dVar20 = 1.0;
    iVar5 = -1;
    iVar14 = 0;
    do {
      if (iVar5 == iVar14) {
        dVar20 = dVar20 * dVar19;
      }
      else {
        dVar20 = 1.0;
      }
      dVar19 = *(double *)(puVar2[8] + (long)iVar7 * 8);
      dVar19 = dVar18 - (dVar16 * dVar19) /
                        (dVar19 - *(double *)(puVar2[7] + (long)iVar7 * 8) * dVar20);
      if (ABS(dVar19 - dVar21) < dVar17 * 0.5) {
        uVar15 = -(ulong)(5.0 < dVar3 / dVar17);
        dVar19 = (double)(uVar15 & 0x3fb999999999999a | ~uVar15 & (ulong)(0.5 / (dVar3 / dVar17))) *
                 dVar16 + dVar21;
      }
      dVar21 = dVar19;
      if (ABS(dVar18 - dVar19) < dVar17 * 0.5) {
        uVar15 = -(ulong)(5.0 < dVar3 / dVar17);
        dVar21 = (double)(uVar15 & 0xbfb999999999999a | ~uVar15 & (ulong)(-0.5 / (dVar3 / dVar17)))
                 * dVar16 + dVar18;
      }
      arkGetDky((ARKodeMem)arkode_mem,dVar21,0,*(N_Vector *)((long)arkode_mem + 0x108));
      iVar5 = (*(code *)*puVar2)(dVar21,*(undefined8 *)((long)arkode_mem + 0x108),puVar2[9],
                                 puVar2[0x10]);
      puVar2[0xd] = puVar2[0xd] + 1;
      if (iVar5 != 0) {
        return -0xc;
      }
      iVar1 = *(int *)(puVar2 + 1);
      lVar6 = (long)iVar1;
      if (0 < lVar6) {
        bVar13 = true;
        bVar4 = false;
        lVar10 = 0;
        dVar17 = 0.0;
LAB_004dd85c:
        do {
          lVar9 = lVar10 + 1;
          if (*(int *)(puVar2[0xe] + -4 + lVar9 * 4) != 0) {
            dVar18 = *(double *)(puVar2[9] + -8 + lVar9 * 8);
            if ((dVar18 != 0.0) || (NAN(dVar18))) {
              dVar3 = *(double *)(puVar2[7] + -8 + lVar9 * 8);
              if (((dVar18 * dVar3 < 0.0) &&
                  ((double)*(int *)(puVar2[3] + -4 + lVar9 * 4) * dVar3 <= 0.0)) &&
                 (dVar18 = ABS(dVar18 / (dVar18 - dVar3)), dVar17 < dVar18)) {
                iVar7 = (int)lVar10;
                bVar13 = false;
                lVar10 = lVar9;
                dVar17 = dVar18;
                if (lVar9 == lVar6) {
                  iVar7 = (int)lVar9 + -1;
                  goto LAB_004dd9b7;
                }
                goto LAB_004dd85c;
              }
            }
            else if ((double)*(int *)(puVar2[3] + -4 + lVar9 * 4) *
                     *(double *)(puVar2[7] + -8 + lVar9 * 8) <= 0.0) {
              bVar4 = true;
            }
          }
          lVar10 = lVar9;
        } while (lVar9 != lVar6);
        if (bVar13) {
          if (!bVar4) {
            puVar2[4] = dVar21;
            if (0 < iVar1) {
              lVar10 = puVar2[7];
              lVar9 = puVar2[9];
              lVar11 = 0;
              do {
                *(undefined8 *)(lVar10 + lVar11 * 8) = *(undefined8 *)(lVar9 + lVar11 * 8);
                lVar11 = lVar11 + 1;
              } while (lVar6 != lVar11);
              dVar21 = (double)puVar2[4];
            }
            goto LAB_004dd979;
          }
          puVar2[5] = dVar21;
          if (iVar1 < 1) {
            puVar2[6] = dVar21;
            return 1;
          }
          lVar10 = puVar2[8];
          lVar9 = puVar2[9];
          lVar11 = 0;
          do {
            *(undefined8 *)(lVar10 + lVar11 * 8) = *(undefined8 *)(lVar9 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          } while (lVar6 != lVar11);
          dVar18 = (double)puVar2[5];
          goto LAB_004dda82;
        }
LAB_004dd9b7:
        puVar2[5] = dVar21;
        dVar18 = dVar21;
        if (0 < iVar1) {
          lVar10 = puVar2[8];
          lVar9 = puVar2[9];
          lVar11 = 0;
          do {
            *(undefined8 *)(lVar10 + lVar11 * 8) = *(undefined8 *)(lVar9 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          } while (lVar6 != lVar11);
          dVar18 = (double)puVar2[5];
        }
        dVar21 = (double)puVar2[4];
        dVar17 = (double)puVar2[0xb];
        dVar16 = dVar18 - dVar21;
        dVar3 = ABS(dVar16);
        if (dVar17 < dVar3) {
          iVar8 = 1;
          dVar19 = 0.5;
          goto LAB_004dda13;
        }
        break;
      }
      puVar2[4] = dVar21;
LAB_004dd979:
      dVar18 = (double)puVar2[5];
      dVar17 = (double)puVar2[0xb];
      dVar16 = dVar18 - dVar21;
      dVar3 = ABS(dVar16);
      if (dVar3 <= dVar17) break;
      iVar8 = 2;
      dVar19 = 2.0;
LAB_004dda13:
      iVar5 = iVar14;
      iVar14 = iVar8;
    } while (dVar17 < dVar3);
    puVar2[6] = dVar18;
    if (iVar1 < 1) {
      return 1;
    }
  }
  else {
LAB_004dda82:
    puVar2[6] = dVar18;
  }
  lVar6 = puVar2[2];
  lVar10 = puVar2[8];
  lVar9 = puVar2[9];
  lVar11 = puVar2[0xe];
  lVar12 = 0;
  do {
    dVar21 = *(double *)(lVar10 + lVar12 * 8);
    *(double *)(lVar9 + lVar12 * 8) = dVar21;
    *(undefined4 *)(lVar6 + lVar12 * 4) = 0;
    if (*(int *)(lVar11 + lVar12 * 4) != 0) {
      if ((dVar21 != 0.0) || (NAN(dVar21))) {
        dVar17 = *(double *)(puVar2[7] + lVar12 * 8);
      }
      else {
        dVar17 = *(double *)(puVar2[7] + lVar12 * 8);
        if ((double)*(int *)(puVar2[3] + lVar12 * 4) * dVar17 <= 0.0) {
          *(uint *)(lVar6 + lVar12 * 4) = (uint)(dVar17 <= 0.0) * 2 + -1;
        }
      }
      if ((dVar21 * dVar17 < 0.0) && ((double)*(int *)(puVar2[3] + lVar12 * 4) * dVar17 <= 0.0)) {
        *(uint *)(lVar6 + lVar12 * 4) = (uint)(dVar17 <= 0.0) * 2 + -1;
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 < *(int *)(puVar2 + 1));
  return 1;
}

Assistant:

int arkRootfind(void* arkode_mem)
{
  realtype alpha, tmid, gfrac, maxfrac, fracint, fracsub;
  int i, retval, imax, side, sideprev;
  booleantype zroot, sgnchg;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkRootfind", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  rootmem = ark_mem->root_mem;

  imax = 0;

  /* First check for change in sign in ghi or for a zero in ghi. */
  maxfrac = ZERO;
  zroot = SUNFALSE;
  sgnchg = SUNFALSE;
  for (i = 0;  i < rootmem->nrtfn; i++) {
    if (!rootmem->gactive[i]) continue;
    if (SUNRabs(rootmem->ghi[i]) == ZERO) {
      if (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) {
        zroot = SUNTRUE;
      }
    } else {
      if ( (rootmem->glo[i]*rootmem->ghi[i] < ZERO) &&
           (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) ) {
        gfrac = SUNRabs(rootmem->ghi[i]/(rootmem->ghi[i] - rootmem->glo[i]));
        if (gfrac > maxfrac) {
          sgnchg = SUNTRUE;
          maxfrac = gfrac;
          imax = i;
        }
      }
    }
  }

  /* If no sign change was found, reset trout and grout.  Then return
     ARK_SUCCESS if no zero was found, or set iroots and return RTFOUND.  */
  if (!sgnchg) {
    rootmem->trout = rootmem->thi;
    for (i = 0; i < rootmem->nrtfn; i++)
      rootmem->grout[i] = rootmem->ghi[i];
    if (!zroot) return(ARK_SUCCESS);
    for (i = 0; i < rootmem->nrtfn; i++) {
      rootmem->iroots[i] = 0;
      if (!rootmem->gactive[i]) continue;
      if (SUNRabs(rootmem->ghi[i]) == ZERO)
        rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1:1;
    }
    return(RTFOUND);
  }

  /* Initialize alpha to avoid compiler warning */
  alpha = ONE;

  /* A sign change was found.  Loop to locate nearest root. */
  side = 0;  sideprev = -1;
  for(;;) {                                    /* Looping point */

    /* If interval size is already less than tolerance ttol, break. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) break;

    /* Set weight alpha.
       On the first two passes, set alpha = 1.  Thereafter, reset alpha
       according to the side (low vs high) of the subinterval in which
       the sign change was found in the previous two passes.
       If the sides were opposite, set alpha = 1.
       If the sides were the same, then double alpha (if high side),
       or halve alpha (if low side).
       The next guess tmid is the secant method value if alpha = 1, but
       is closer to tlo if alpha < 1, and closer to thi if alpha > 1.    */
    if (sideprev == side) {
      alpha = (side == 2) ? alpha*TWO : alpha*HALF;
    } else {
      alpha = ONE;
    }

    /* Set next root approximation tmid and get g(tmid).
       If tmid is too close to tlo or thi, adjust it inward,
       by a fractional distance that is between 0.1 and 0.5.  */
    tmid = rootmem->thi - (rootmem->thi - rootmem->tlo) *
      rootmem->ghi[imax]/(rootmem->ghi[imax] - alpha*rootmem->glo[imax]);
    if (SUNRabs(tmid - rootmem->tlo) < HALF*rootmem->ttol) {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo)/rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF/fracint;
      tmid = rootmem->tlo + fracsub*(rootmem->thi - rootmem->tlo);
    }
    if (SUNRabs(rootmem->thi - tmid) < HALF*rootmem->ttol) {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo)/rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF/fracint;
      tmid = rootmem->thi - fracsub*(rootmem->thi - rootmem->tlo);
    }

    (void) arkGetDky(ark_mem, tmid, 0, ark_mem->ycur);
    retval = rootmem->gfun(tmid, ark_mem->ycur, rootmem->grout,
                           rootmem->root_data);
    rootmem->nge++;
    if (retval != 0) return(ARK_RTFUNC_FAIL);

    /* Check to see in which subinterval g changes sign, and reset imax.
       Set side = 1 if sign change is on low side, or 2 if on high side.  */
    maxfrac = ZERO;
    zroot = SUNFALSE;
    sgnchg = SUNFALSE;
    sideprev = side;
    for (i = 0;  i < rootmem->nrtfn; i++) {
      if (!rootmem->gactive[i]) continue;
      if (SUNRabs(rootmem->grout[i]) == ZERO) {
        if (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) {
          zroot = SUNTRUE;
        }
      } else {
        if ( (rootmem->glo[i]*rootmem->grout[i] < ZERO) &&
             (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) ) {
          gfrac = SUNRabs(rootmem->grout[i]/(rootmem->grout[i] - rootmem->glo[i]));
          if (gfrac > maxfrac) {
            sgnchg = SUNTRUE;
            maxfrac = gfrac;
            imax = i;
          }
        }
      }
    }
    if (sgnchg) {
      /* Sign change found in (tlo,tmid); replace thi with tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
        rootmem->ghi[i] = rootmem->grout[i];
      side = 1;
      /* Stop at root thi if converged; otherwise loop. */
      if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) break;
      continue;  /* Return to looping point. */
    }

    if (zroot) {
      /* No sign change in (tlo,tmid), but g = 0 at tmid; return root tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
        rootmem->ghi[i] = rootmem->grout[i];
      break;
    }

    /* No sign change in (tlo,tmid), and no zero at tmid.
       Sign change must be in (tmid,thi).  Replace tlo with tmid. */
    rootmem->tlo = tmid;
    for (i = 0; i < rootmem->nrtfn; i++)
      rootmem->glo[i] = rootmem->grout[i];
    side = 2;
    /* Stop at root thi if converged; otherwise loop back. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol)
      break;

  } /* End of root-search loop */

  /* Reset trout and grout, set iroots, and return RTFOUND. */
  rootmem->trout = rootmem->thi;
  for (i = 0; i < rootmem->nrtfn; i++) {
    rootmem->grout[i] = rootmem->ghi[i];
    rootmem->iroots[i] = 0;
    if (!rootmem->gactive[i]) continue;
    if ( (SUNRabs(rootmem->ghi[i]) == ZERO) &&
         (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) )
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1:1;
    if ( (rootmem->glo[i]*rootmem->ghi[i] < ZERO) &&
         (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) )
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1:1;
  }
  return(RTFOUND);
}